

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnImportEvent
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index event_index,Index sig_index)

{
  string_view sVar1;
  
  PrintDetails(this," - event[%u] sig=%u",(ulong)event_index,(ulong)sig_index);
  sVar1 = BinaryReaderObjdumpBase::GetEventName(&this->super_BinaryReaderObjdumpBase,event_index);
  if (sVar1.size_ != 0) {
    PrintDetails(this," <%.*s>",sVar1.size_,sVar1.data_);
  }
  PrintDetails(this," <- %.*s.%.*s\n",module_name.size_ & 0xffffffff,module_name.data_,
               field_name.size_ & 0xffffffff,field_name.data_);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnImportEvent(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index event_index,
                                          Index sig_index) {
  PrintDetails(" - event[%" PRIindex "] sig=%" PRIindex, event_index,
               sig_index);
  auto name = GetEventName(event_index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}